

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector2.cc
# Opt level: O3

ostream * RVO::operator<<(ostream *stream,Vector2 *vector)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
  poVar1 = std::ostream::_M_insert<double>((double)vector->x_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>((double)vector->y_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Vector2 &vector) {
  stream << "(" << vector.x() << "," << vector.y() << ")";

  return stream;
}